

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O3

int Fl_Plugin_Manager::load(char *filename)

{
  long lVar1;
  
  lVar1 = dlopen(filename,1);
  return -(uint)(lVar1 == 0);
}

Assistant:

int Fl_Plugin_Manager::load(const char *filename) {
  // the functions below will autmaticaly load plugins that are defined:
  // Fl_My_Plugin plugin();
#if defined(WIN32) && !defined(__CYGWIN__)
  HMODULE dl = LoadLibrary(filename);
#else
  void * dl = NULL;
# if HAVE_DLSYM
    dl = dlopen(filename, RTLD_LAZY);
# endif
#endif
  // There is no way of unloading a plugin!
  return (dl!=0) ? 0 : -1;
}